

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall chrono::utils::MixtureIngredient::freeMaterialDist(MixtureIngredient *this)

{
  ::operator_delete(this->m_frictionDist,0x10);
  ::operator_delete(this->m_cohesionDist,0x10);
  ::operator_delete(this->m_youngDist,0x10);
  ::operator_delete(this->m_poissonDist,0x10);
  ::operator_delete(this->m_restitutionDist,0x10);
  this->m_restitutionDist = (normal_distribution<float> *)0x0;
  this->m_frictionDist = (normal_distribution<float> *)0x0;
  this->m_cohesionDist = (normal_distribution<float> *)0x0;
  this->m_youngDist = (normal_distribution<float> *)0x0;
  this->m_poissonDist = (normal_distribution<float> *)0x0;
  return;
}

Assistant:

void MixtureIngredient::freeMaterialDist() {
    delete m_frictionDist;
    delete m_cohesionDist;
    delete m_youngDist;
    delete m_poissonDist;
    delete m_restitutionDist;

    m_frictionDist = nullptr;
    m_cohesionDist = nullptr;
    m_youngDist = nullptr;
    m_poissonDist = nullptr;
    m_restitutionDist = nullptr;
}